

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall TPZMatrix<long>::Identity(TPZMatrix<long> *this)

{
  _func_int **pp_Var1;
  long lVar2;
  int64_t col;
  long lVar3;
  int64_t row;
  long lVar4;
  ulong local_28;
  
  if ((this->super_TPZBaseMatrix).fCol != (this->super_TPZBaseMatrix).fRow) {
    Error("identity (TPZMatrix<>*) <TPZMatrix<>must be square>",(char *)0x0);
  }
  for (lVar4 = 0; lVar4 < (this->super_TPZBaseMatrix).fRow; lVar4 = lVar4 + 1) {
    for (lVar3 = 0; lVar3 < (this->super_TPZBaseMatrix).fCol; lVar3 = lVar3 + 1) {
      if (lVar4 != lVar3) {
        pp_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
        lVar2 = lVar3;
      }
      else {
        pp_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
        lVar2 = lVar4;
      }
      local_28 = (ulong)(lVar4 == lVar3);
      (*pp_Var1[0x23])(this,lVar4,lVar2,&local_28);
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Identity() {
	
    if ( Cols() != Rows() ) {
        Error( "identity (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,1.):PutVal(row,col,0.);
        }
    }
}